

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_peek_bitset.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::hash_peek_bitset<char>::
set_class<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (hash_peek_bitset<char> *this,char_class_type char_class,bool no,
          regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  size_t i;
  size_t __position;
  
  for (__position = 0; __position != 0x100; __position = __position + 1) {
    if ((((tr->super_cpp_regex_traits<char>).super_cpp_regex_traits_base<char,_1UL>.masks_
          [__position] & char_class) != 0) != no) {
      std::bitset<256UL>::set(&this->bset_,__position,true);
    }
  }
  return;
}

Assistant:

void set_class(typename Traits::char_class_type char_class, bool no, Traits const &tr)
    {
        if(1 != sizeof(char_type))
        {
            // wide character set, no efficient way of filling in the bitset, so set them all to 1
            this->set_all();
        }
        else
        {
            for(std::size_t i = 0; i <= UCHAR_MAX; ++i)
            {
                char_type ch = std::char_traits<char_type>::to_char_type(static_cast<int_type>(i));
                if(no != tr.isctype(ch, char_class))
                {
                    this->bset_.set(i);
                }
            }
        }
    }